

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O2

void __thiscall webrtc::SincResampler::SetRatio(SincResampler *this,double io_sample_rate_ratio)

{
  float fVar1;
  float fVar2;
  double dVar3;
  long lVar4;
  size_t offset_idx;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  if (2.220446049250313e-16 <= ABS(this->io_sample_rate_ratio_ - io_sample_rate_ratio)) {
    this->io_sample_rate_ratio_ = io_sample_rate_ratio;
    dVar3 = (double)(~-(ulong)(1.0 < io_sample_rate_ratio) & 0x3feccccccccccccd |
                    (ulong)((1.0 / io_sample_rate_ratio) * 0.9) &
                    -(ulong)(1.0 < io_sample_rate_ratio));
    lVar7 = 0;
    for (lVar5 = 0; lVar4 = 0x20, lVar6 = lVar7, lVar5 != 0x21; lVar5 = lVar5 + 1) {
      while (lVar4 != 0) {
        fVar1 = *(float *)((long)(this->kernel_window_storage_)._M_t.
                                 super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar6);
        fVar2 = *(float *)((long)(this->kernel_pre_sinc_storage_)._M_t.
                                 super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar6);
        if ((fVar2 != 0.0) || (dVar8 = dVar3, NAN(fVar2))) {
          dVar8 = sin(dVar3 * (double)fVar2);
          dVar8 = dVar8 / (double)fVar2;
        }
        *(float *)((long)(this->kernel_storage_)._M_t.
                         super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
                         super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
                         super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar6) =
             (float)(dVar8 * (double)fVar1);
        lVar4 = lVar4 + -1;
        lVar6 = lVar6 + 4;
      }
      lVar7 = lVar7 + 0x80;
    }
  }
  return;
}

Assistant:

void SincResampler::SetRatio(double io_sample_rate_ratio) {
  if (fabs(io_sample_rate_ratio_ - io_sample_rate_ratio) <
      std::numeric_limits<double>::epsilon()) {
    return;
  }

  io_sample_rate_ratio_ = io_sample_rate_ratio;

  // Optimize reinitialization by reusing values which are independent of
  // |sinc_scale_factor|.  Provides a 3x speedup.
  const double sinc_scale_factor = SincScaleFactor(io_sample_rate_ratio_);
  for (size_t offset_idx = 0; offset_idx <= kKernelOffsetCount; ++offset_idx) {
    for (size_t i = 0; i < kKernelSize; ++i) {
      const size_t idx = i + offset_idx * kKernelSize;
      const float window = kernel_window_storage_[idx];
      const float pre_sinc = kernel_pre_sinc_storage_[idx];

      kernel_storage_[idx] = static_cast<float>(window *
          ((pre_sinc == 0) ?
              sinc_scale_factor :
              (sin(sinc_scale_factor * pre_sinc) / pre_sinc)));
    }
  }
}